

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

void __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::Delete(FreeList<wabt::interp::Ref> *this,Index index)

{
  reference rVar1;
  Index local_18;
  
  (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start[index].index = 0;
  local_18 = index;
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_free_,index);
  *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->free_,&local_18);
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  list_[index] = T();
  is_free_[index] = true;
  free_.push_back(index);
}